

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.h
# Opt level: O2

Mat * __thiscall
ncnn::Mat::reshape(Mat *__return_storage_ptr__,Mat *this,int _w,int _h,Allocator *allocator)

{
  size_t sVar1;
  int iVar2;
  size_t sVar3;
  int i;
  long lVar4;
  
  sVar1 = (long)this->h * (long)this->w;
  sVar3 = (long)this->c * sVar1;
  if ((int)sVar3 == _h * _w) {
    if ((this->dims == 3) && (this->cstep != sVar1)) {
      __return_storage_ptr__->dims = 0;
      __return_storage_ptr__->w = 0;
      __return_storage_ptr__->h = 0;
      __return_storage_ptr__->c = 0;
      __return_storage_ptr__->elemsize = 0;
      __return_storage_ptr__->allocator = (Allocator *)0x0;
      __return_storage_ptr__->data = (void *)0x0;
      __return_storage_ptr__->refcount = (int *)0x0;
      __return_storage_ptr__->cstep = 0;
      create(__return_storage_ptr__,_w,_h,this->elemsize,allocator);
      for (lVar4 = 0; lVar4 < this->c; lVar4 = lVar4 + 1) {
        sVar1 = this->elemsize;
        iVar2 = this->h * this->w;
        memcpy((void *)((long)((int)lVar4 * iVar2) * sVar1 + (long)__return_storage_ptr__->data),
               (void *)(this->cstep * lVar4 * sVar1 + (long)this->data),(long)iVar2 * sVar1);
      }
    }
    else {
      Mat(__return_storage_ptr__,this);
      __return_storage_ptr__->dims = 2;
      __return_storage_ptr__->w = _w;
      __return_storage_ptr__->h = _h;
      __return_storage_ptr__->c = 1;
      __return_storage_ptr__->cstep = sVar3;
    }
  }
  else {
    __return_storage_ptr__->dims = 0;
    __return_storage_ptr__->w = 0;
    __return_storage_ptr__->h = 0;
    __return_storage_ptr__->c = 0;
    __return_storage_ptr__->elemsize = 0;
    __return_storage_ptr__->allocator = (Allocator *)0x0;
    __return_storage_ptr__->data = (void *)0x0;
    __return_storage_ptr__->refcount = (int *)0x0;
    __return_storage_ptr__->cstep = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

inline Mat Mat::reshape(int _w, int _h, Allocator* allocator) const
{
    if (w * h * c != _w * _h)
        return Mat();

    if (dims == 3 && cstep != (size_t)w * h)
    {
        Mat m;
        m.create(_w, _h, elemsize, allocator);

        // flatten
        for (int i=0; i<c; i++)
        {
            const void* ptr = (unsigned char*)data + i * cstep * elemsize;
            void* mptr = (unsigned char*)m.data + i * w * h * elemsize;
            memcpy(mptr, ptr, w * h * elemsize);
        }

        return m;
    }

    Mat m = *this;

    m.dims = 2;
    m.w = _w;
    m.h = _h;
    m.c = 1;

    m.cstep = _w * _h;

    return m;
}